

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall
Number_N10DefaultBase16_Test<wchar_t>::Number_N10DefaultBase16_Test
          (Number_N10DefaultBase16_Test<wchar_t> *this)

{
  anon_unknown.dwarf_d9a9a::Number<wchar_t>::Number(&this->super_Number<wchar_t>);
  (this->super_Number<wchar_t>).super_Test._vptr_Test = (_func_int **)&PTR__Number_001d7870;
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase16) {
    pstore::dump::number_base::hex ();
    pstore::dump::number_long v (10, 16);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("0xa");
    EXPECT_EQ (expected, actual);
}